

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,AssignmentStatement *statement)

{
  int iVar1;
  int iVar2;
  SubtreeWrapper *pSVar3;
  undefined4 extraout_var;
  StatementWrapper *this_00;
  MoveStatement *this_01;
  undefined4 extraout_var_00;
  
  pSVar3 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->lvalue_->super_Node);
  iVar1 = (*pSVar3->_vptr_SubtreeWrapper[2])(pSVar3);
  pSVar3 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  this_00 = (StatementWrapper *)operator_new(0x10);
  this_01 = (MoveStatement *)operator_new(0x18);
  iVar2 = (*pSVar3->_vptr_SubtreeWrapper[2])(pSVar3);
  IRT::MoveStatement::MoveStatement
            (this_01,(Expression *)CONCAT44(extraout_var,iVar1),
             (Expression *)CONCAT44(extraout_var_00,iVar2));
  IRT::StatementWrapper::StatementWrapper(this_00,(Statement *)this_01);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(AssignmentStatement* statement) {
  auto var_expression = Accept(statement->lvalue_)->ToExpression();
  auto rvalue = Accept(statement->expression_);

  tos_value_ = new IRT::StatementWrapper(
      new IRT::MoveStatement(var_expression, rvalue->ToExpression()));
}